

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionRTQF.cpp
# Opt level: O0

void __thiscall RTFusionRTQF::predict(RTFusionRTQF *this)

{
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  RTFLOAT RVar3;
  RTFLOAT RVar4;
  RTFLOAT RVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  RTFLOAT qz;
  RTFLOAT qy;
  RTFLOAT qx;
  RTFLOAT qs;
  RTFLOAT z2;
  RTFLOAT y2;
  RTFLOAT x2;
  RTFusionRTQF *this_local;
  
  if (((this->super_RTFusion).m_enableGyro & 1U) != 0) {
    RVar1 = RTQuaternion::scalar(&this->m_stateQ);
    RVar2 = RTQuaternion::x(&this->m_stateQ);
    RVar3 = RTQuaternion::y(&this->m_stateQ);
    RVar4 = RTQuaternion::z(&this->m_stateQ);
    RVar5 = RTVector3::x(&this->m_gyro);
    fVar6 = RVar5 / 2.0;
    RVar5 = RTVector3::y(&this->m_gyro);
    fVar7 = RVar5 / 2.0;
    RVar5 = RTVector3::z(&this->m_gyro);
    fVar8 = RVar5 / 2.0;
    RTQuaternion::setScalar
              (&this->m_stateQ,
               (-fVar8 * RVar4 + -fVar6 * RVar2 + -(fVar7 * RVar3)) * this->m_timeDelta + RVar1);
    RTQuaternion::setX(&this->m_stateQ,
                       (-fVar7 * RVar4 + fVar6 * RVar1 + fVar8 * RVar3) * this->m_timeDelta + RVar2)
    ;
    RTQuaternion::setY(&this->m_stateQ,
                       (fVar6 * RVar4 + fVar7 * RVar1 + -(fVar8 * RVar2)) * this->m_timeDelta +
                       RVar3);
    RTQuaternion::setZ(&this->m_stateQ,
                       (-fVar6 * RVar3 + fVar8 * RVar1 + fVar7 * RVar2) * this->m_timeDelta + RVar4)
    ;
    RTQuaternion::normalize(&this->m_stateQ);
  }
  return;
}

Assistant:

void RTFusionRTQF::predict()
{
    RTFLOAT x2, y2, z2;
    RTFLOAT qs, qx, qy,qz;

    if (!m_enableGyro)
        return;

    qs = m_stateQ.scalar();
    qx = m_stateQ.x();
    qy = m_stateQ.y();
    qz = m_stateQ.z();

    x2 = m_gyro.x() / (RTFLOAT)2.0;
    y2 = m_gyro.y() / (RTFLOAT)2.0;
    z2 = m_gyro.z() / (RTFLOAT)2.0;

    // Predict new state

    m_stateQ.setScalar(qs + (-x2 * qx - y2 * qy - z2 * qz) * m_timeDelta);
    m_stateQ.setX(qx + (x2 * qs + z2 * qy - y2 * qz) * m_timeDelta);
    m_stateQ.setY(qy + (y2 * qs - z2 * qx + x2 * qz) * m_timeDelta);
    m_stateQ.setZ(qz + (z2 * qs + y2 * qx - x2 * qy) * m_timeDelta);
    m_stateQ.normalize();
}